

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O2

void __thiscall Writer::functionDefinitions(Writer *this,Program *program)

{
  uint uVar1;
  DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_> *pDVar2;
  Func *func_00;
  pointer ppVVar3;
  Block *block;
  long lVar4;
  pointer ppFVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  pointer ppFVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var10;
  __normal_iterator<const_Func_**,_std::vector<const_Func_*,_std::allocator<const_Func_*>_>_> __i;
  long lVar11;
  pointer ppFVar12;
  pointer ppVVar13;
  vector<const_Func_*,_std::allocator<const_Func_*>_> functions;
  const_iterator __begin1;
  Func *func;
  
  functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __begin1 = llvm::
             DenseMapBase<llvm::DenseMap<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>,_const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>
             ::begin((DenseMapBase<llvm::DenseMap<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>,_const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>
                      *)&program->functions);
  uVar1 = (program->functions).NumBuckets;
  pDVar2 = (program->functions).Buckets;
  while (ppFVar9 = functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,
        ppFVar5 = functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
                  super__Vector_impl_data._M_start, __begin1.Ptr != pDVar2 + uVar1) {
    func = ((__begin1.Ptr)->
           super_pair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>).
           second._M_t.super___uniq_ptr_impl<Func,_std::default_delete<Func>_>._M_t.
           super__Tuple_impl<0UL,_Func_*,_std::default_delete<Func>_>.
           super__Head_base<0UL,_Func_*,_false>._M_head_impl;
    if (func->isDeclaration == false) {
      bVar6 = isFunctionPrinted(this,func);
      if (bVar6) {
        std::vector<const_Func_*,_std::allocator<const_Func_*>_>::push_back(&functions,&func);
      }
    }
    llvm::
    DenseMapIterator<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>,_true>
    ::operator++(&__begin1);
  }
  if (functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar11 = (long)functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
    uVar8 = lVar11 >> 3;
    lVar4 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Writer::functionDefinitions(Program_const&)::__0>>
              (functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar11 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Writer::functionDefinitions(Program_const&)::__0>>
                (ppFVar5,ppFVar9);
    }
    else {
      ppFVar12 = ppFVar5 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Writer::functionDefinitions(Program_const&)::__0>>
                (ppFVar5,ppFVar12);
      for (; ppFVar12 != ppFVar9; ppFVar12 = ppFVar12 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<Writer::functionDefinitions(Program_const&)::__0>>
                  (ppFVar12);
      }
    }
  }
  ppFVar5 = functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar9 = functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar9 != ppFVar5; ppFVar9 = ppFVar9 + 1) {
    func_00 = *ppFVar9;
    functionHead(this,func_00,false);
    CWriter::startFunctionBody(&this->wr);
    ppVVar3 = (func_00->variables).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar13 = (func_00->variables).super__Vector_base<Value_*,_std::allocator<Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppVVar13 != ppVVar3;
        ppVVar13 = ppVVar13 + 1) {
      CWriter::indent(&this->wr,1);
      iVar7 = (*((*ppVVar13)->super_ExprBase).super_Expr._vptr_Expr[4])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x18))
                ((StrRef)&__begin1,(long *)CONCAT44(extraout_var,iVar7));
      iVar7 = (*((*ppVVar13)->super_ExprBase).super_Expr._vptr_Expr[4])();
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x20))
                ((StrRef)&func,(long *)CONCAT44(extraout_var_00,iVar7),&(*ppVVar13)->valueName);
      CWriter::declareVar(&this->wr,(StrRef)&__begin1,(StrRef)&func);
      std::__cxx11::string::~string((string *)&func);
      std::__cxx11::string::~string((string *)&__begin1);
    }
    writeBlock(this,func_00->entry);
    for (p_Var10 = (func_00->blockMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(func_00->blockMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      block = (Block *)p_Var10[1]._M_parent;
      if ((block != func_00->entry) && (block->doInline == false)) {
        writeBlock(this,block);
      }
    }
    CWriter::endFunctionBody(&this->wr);
    std::__cxx11::string::string((string *)&__begin1,"",(allocator *)&func);
    CWriter::line(&this->wr,(StrRef)&__begin1);
    std::__cxx11::string::~string((string *)&__begin1);
  }
  std::_Vector_base<const_Func_*,_std::allocator<const_Func_*>_>::~_Vector_base
            (&functions.super__Vector_base<const_Func_*,_std::allocator<const_Func_*>_>);
  return;
}

Assistant:

void Writer::functionDefinitions(const Program& program) {
    std::vector<const Func*> functions;

    for (const auto& pair : program.functions) {
        const auto* func = pair.second.get();
        if (func->isDeclaration) {
            continue;
        }

        if (!isFunctionPrinted(func)) {
            continue;
        }

        functions.push_back(func);
    }

    std::sort(functions.begin(), functions.end(), [](const Func* a, const Func* b){ return a->name <= b->name;});

    for (const auto* func : functions) {

        functionHead(func);
        wr.startFunctionBody();

        // start with variables
        for (const auto& var : func->variables) {
            wr.indent(1);
            wr.declareVar(var->getType()->toString(), var->getType()->surroundName(var->valueName));
        }

        assert(func->entry);
        writeBlock(func->entry);

        for (const auto& blockEntry : func->blockMap) {
            const auto* block = blockEntry.second.get();

            if (block == func->entry)
                continue;

            if (!block->doInline) {
                writeBlock(block);
            }
        }

        wr.endFunctionBody();
        wr.line("");
    }
}